

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
::destroy_slots(raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
                *this)

{
  bool bVar1;
  ctrl_t *pcVar2;
  size_t *psVar3;
  long *in_RDI;
  LayoutType<sizeof___(Ts),_signed_char,_unsigned_long> LVar4;
  Layout layout;
  size_t i;
  slot_type *in_stack_ffffffffffffffc8;
  allocator<unsigned_long> *in_stack_ffffffffffffffd0;
  allocator<unsigned_long> *alloc;
  
  if (in_RDI[3] != 0) {
    for (alloc = (allocator<unsigned_long> *)0x0; alloc != (allocator<unsigned_long> *)in_RDI[3];
        alloc = alloc + 1) {
      bVar1 = IsFull((ctrl_t)alloc[*in_RDI]);
      if (bVar1) {
        alloc_ref((raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)0x544cfe);
        hash_policy_traits<phmap::priv::FlatHashSetPolicy<unsigned_long>,void>::
        destroy<std::allocator<unsigned_long>>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      }
    }
    LVar4.size_ = (size_t  [2])MakeLayout(0x544d3b);
    SanitizerUnpoisonMemoryRegion((void *)in_RDI[1],in_RDI[3] << 3);
    alloc_ref((raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
               *)0x544d68);
    internal_layout::
    LayoutImpl<std::tuple<signed_char,_unsigned_long>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
    ::AllocSize((LayoutImpl<std::tuple<signed_char,_unsigned_long>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
                 *)*in_RDI);
    Deallocate<8ul,std::allocator<unsigned_long>>(alloc,LVar4.size_[1],LVar4.size_[0]);
    pcVar2 = EmptyGroup();
    *in_RDI = (long)pcVar2;
    in_RDI[1] = 0;
    in_RDI[2] = 0;
    in_RDI[3] = 0;
    psVar3 = growth_left((raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)0x544dc1);
    *psVar3 = 0;
  }
  return;
}

Assistant:

void destroy_slots()
			{
				if (!capacity_) return;
				for (size_t i = 0; i != capacity_; ++i) {
					if (IsFull(ctrl_[i])) {
						PolicyTraits::destroy(&alloc_ref(), slots_ + i);
					}
				}
				auto layout = MakeLayout(capacity_);
				// Unpoison before returning the memory to the allocator.
				SanitizerUnpoisonMemoryRegion(slots_, sizeof(slot_type) * capacity_);
				Deallocate<Layout::Alignment()>(&alloc_ref(), ctrl_, layout.AllocSize());
				ctrl_ = EmptyGroup();
				slots_ = nullptr;
				size_ = 0;
				capacity_ = 0;
				growth_left() = 0;
			}